

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_intervals.h
# Opt level: O0

vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_> *
__thiscall
Gudhi::Persistence_representations::Persistence_intervals::compute_persistent_betti_numbers
          (vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
           *__return_storage_ptr__,Persistence_intervals *this)

{
  size_type sVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  reference this_00;
  pair<double,_bool> pVar5;
  pair<double,_unsigned_long> pVar6;
  pair<double,_unsigned_long> local_d8;
  size_type local_c8;
  size_t i_1;
  unsigned_long local_b8;
  size_t pbn;
  __normal_iterator<std::pair<double,_bool>_*,_std::vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>_>
  local_a8;
  double local_a0;
  undefined1 local_98;
  bool local_89;
  pair<double,_bool> local_88;
  double local_78;
  undefined1 local_70;
  bool local_61;
  pair<double,_bool> local_60;
  size_type local_50;
  size_t i;
  allocator<std::pair<double,_bool>_> local_31;
  undefined1 local_30 [8];
  vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_> places_where_pbs_change
  ;
  Persistence_intervals *this_local;
  vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_> *pbns
  ;
  
  places_where_pbs_change.
  super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  sVar1 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::size
                    (&this->intervals);
  std::allocator<std::pair<double,_bool>_>::allocator(&local_31);
  std::vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>::vector
            ((vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_> *)local_30,
             sVar1 * 2,&local_31);
  std::allocator<std::pair<double,_bool>_>::~allocator(&local_31);
  for (local_50 = 0; sVar1 = local_50,
      sVar2 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
              size(&this->intervals), sVar1 != sVar2; local_50 = local_50 + 1) {
    pvVar3 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[](&this->intervals,local_50);
    local_61 = true;
    pVar5 = std::make_pair<double_const&,bool>(&pvVar3->first,&local_61);
    local_78 = pVar5.first;
    local_70 = pVar5.second;
    local_60.first = local_78;
    local_60.second = (bool)local_70;
    pvVar4 = std::vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>::
             operator[]((vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
                         *)local_30,local_50 * 2);
    std::pair<double,_bool>::operator=(pvVar4,&local_60);
    pvVar3 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[](&this->intervals,local_50);
    local_89 = false;
    pVar5 = std::make_pair<double_const&,bool>(&pvVar3->second,&local_89);
    local_a0 = pVar5.first;
    local_98 = pVar5.second;
    local_88.first = local_a0;
    local_88.second = (bool)local_98;
    pvVar4 = std::vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>::
             operator[]((vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
                         *)local_30,local_50 * 2 + 1);
    std::pair<double,_bool>::operator=(pvVar4,&local_88);
  }
  local_a8._M_current =
       (pair<double,_bool> *)
       std::vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>::begin
                 ((vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_> *)
                  local_30);
  pbn = (size_t)std::vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>::end
                          ((vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
                            *)local_30);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<double,bool>*,std::vector<std::pair<double,bool>,std::allocator<std::pair<double,bool>>>>,bool(*)(std::pair<double,bool>const&,std::pair<double,bool>const&)>
            (local_a8,(__normal_iterator<std::pair<double,_bool>_*,_std::vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>_>
                       )pbn,compare_first_element_of_pair<double>);
  local_b8 = 0;
  i_1._7_1_ = 0;
  sVar1 = std::vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>::size
                    ((vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_> *)
                     local_30);
  std::allocator<std::pair<double,_unsigned_long>_>::allocator
            ((allocator<std::pair<double,_unsigned_long>_> *)((long)&i_1 + 6));
  std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
  ::vector(__return_storage_ptr__,sVar1,
           (allocator<std::pair<double,_unsigned_long>_> *)((long)&i_1 + 6));
  std::allocator<std::pair<double,_unsigned_long>_>::~allocator
            ((allocator<std::pair<double,_unsigned_long>_> *)((long)&i_1 + 6));
  local_c8 = 0;
  while( true ) {
    sVar1 = local_c8;
    sVar2 = std::vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>::size
                      ((vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_> *
                       )local_30);
    if (sVar1 == sVar2) break;
    pvVar4 = std::vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>::
             operator[]((vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
                         *)local_30,local_c8);
    if ((pvVar4->second & 1U) == 1) {
      local_b8 = local_b8 + 1;
    }
    else {
      local_b8 = local_b8 - 1;
    }
    pvVar4 = std::vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>::
             operator[]((vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
                         *)local_30,local_c8);
    pVar6 = std::make_pair<double&,unsigned_long&>(&pvVar4->first,&local_b8);
    local_d8 = pVar6;
    this_00 = std::
              vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
              ::operator[](__return_storage_ptr__,local_c8);
    std::pair<double,_unsigned_long>::operator=(this_00,&local_d8);
    local_c8 = local_c8 + 1;
  }
  i_1._7_1_ = 1;
  std::vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>::~vector
            ((vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_> *)local_30)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<double, size_t> > Persistence_intervals::compute_persistent_betti_numbers() const {
  std::vector<std::pair<double, bool> > places_where_pbs_change(2 * this->intervals.size());

  for (size_t i = 0; i != this->intervals.size(); ++i) {
    places_where_pbs_change[2 * i] = std::make_pair(this->intervals[i].first, true);
    places_where_pbs_change[2 * i + 1] = std::make_pair(this->intervals[i].second, false);
  }

  std::sort(places_where_pbs_change.begin(), places_where_pbs_change.end(), compare_first_element_of_pair<double>);
  size_t pbn = 0;
  std::vector<std::pair<double, size_t> > pbns(places_where_pbs_change.size());
  for (size_t i = 0; i != places_where_pbs_change.size(); ++i) {
    if (places_where_pbs_change[i].second == true) {
      ++pbn;
    } else {
      --pbn;
    }
    pbns[i] = std::make_pair(places_where_pbs_change[i].first, pbn);
  }
  return pbns;
}